

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O1

void __thiscall
GeneralHash<0,_unsigned_int,_unsigned_char>::GeneralHash
          (GeneralHash<0,_unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  
  this->hashvalue = 0;
  this->wordsize = mywordsize;
  this->n = myn;
  this->irreduciblepoly = 0;
  uVar2 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar2);
  iVar1 = this->wordsize;
  this->lastbit = 1 << ((byte)iVar1 & 0x1f);
  (this->precomputedshift).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->precomputedshift).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->precomputedshift).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar1 == 0x13) {
    uVar2 = 0x80027;
  }
  else {
    if (iVar1 != 9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unsupported wordsize ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->wordsize);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," bits, try 19 or 9",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return;
    }
    uVar2 = 0x22d;
  }
  this->irreduciblepoly = uVar2;
  return;
}

Assistant:

GeneralHash(int myn, int mywordsize = 19)
      : hashvalue(0), wordsize(mywordsize), n(myn), irreduciblepoly(0),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        lastbit(static_cast<hashvaluetype>(1) << wordsize),
        precomputedshift(precomputationtype == FULLPRECOMP ? (1 << n) : 0) {
    if (wordsize == 19) {
      irreduciblepoly = 1 + (1 << 1) + (1 << 2) + (1 << 5) + (1 << 19);
    } else if (wordsize == 9) {
      irreduciblepoly = 1 + (1 << 2) + (1 << 3) + (1 << 5) + (1 << 9);
    } else {
      cerr << "unsupported wordsize " << wordsize << " bits, try 19 or 9"
           << endl;
    }
    // in case the precomp is activated at the template level
    if (precomputationtype == FULLPRECOMP) {
      for (hashvaluetype x = 0; x < precomputedshift.size(); ++x) {
        hashvaluetype leftover = x << (wordsize - n);
        fastleftshift(leftover, n);
        precomputedshift[x] = leftover;
      }
    }
  }